

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O0

bool __thiscall CAPSFile::DecodeData(CAPSFile *this,DataChunks item,IDisk *disk)

{
  byte byte_00;
  bool bVar1;
  byte bVar2;
  uchar byte_01;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  pointer paVar7;
  reference __src;
  byte *pbVar8;
  ulong uVar9;
  uint uVar10;
  byte local_179;
  uint local_164;
  int local_160;
  uint c_5;
  int gp;
  int nb_bytes;
  uint c_4;
  uint c_3;
  int dbg;
  int iStack_144;
  uchar byte_1;
  int c_2;
  int c_1;
  int iStack_138;
  uchar byte;
  int val_1;
  int d_1;
  int maxbits_1;
  int val;
  int d;
  int maxbits;
  int iStack_11c;
  uchar bitfield;
  int c;
  int j;
  int data_size;
  int data_type;
  int size_width;
  uint offset_before;
  uchar b;
  bool backward_gap;
  uint uStack_100;
  bool forward_gap;
  uint total_gap;
  StreamItem forward_stream;
  StreamItem backward_stream;
  uchar *current_block_data;
  uchar *current_block_gap;
  int data_offset;
  int gap_default;
  int block_flags;
  int encoder_type;
  int cell_type;
  uint gap_offset;
  int gap_bytes;
  int data_bytes;
  uint gap_bits;
  int data_bits;
  uint i;
  uint index_track;
  int total_data;
  __normal_iterator<CAPSFile::ImgeItem_*,_std::vector<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>_>
  local_a0;
  __normal_iterator<CAPSFile::ImgeItem_*,_std::vector<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>_>
  local_98;
  iterator it;
  bool found;
  ImgeItem imge_item;
  int total_total;
  uchar *data_block;
  uchar *block;
  uint offset;
  IDisk *disk_local;
  CAPSFile *this_local;
  
  block._4_4_ = 0;
  if (item.size != 0) {
    it._M_current._3_1_ = 0;
    local_98._M_current =
         (anon_struct_80_16_0595f1fa *)
         std::vector<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>::begin
                   (&this->list_imge_);
    while( true ) {
      local_a0._M_current =
           (anon_struct_80_16_0595f1fa *)
           std::vector<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>::end
                     (&this->list_imge_);
      bVar1 = __gnu_cxx::operator!=(&local_98,&local_a0);
      local_179 = 0;
      if (bVar1) {
        local_179 = it._M_current._3_1_ ^ 0xff;
      }
      if ((local_179 & 1) == 0) break;
      paVar7 = __gnu_cxx::
               __normal_iterator<CAPSFile::ImgeItem_*,_std::vector<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>_>
               ::operator->(&local_98);
      if (paVar7->data_key == item.data_id) {
        __src = __gnu_cxx::
                __normal_iterator<CAPSFile::ImgeItem_*,_std::vector<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>_>
                ::operator*(&local_98);
        memcpy((void *)((long)&it._M_current + 4),__src,0x50);
        it._M_current._3_1_ = 1;
      }
      _index_track = __gnu_cxx::
                     __normal_iterator<CAPSFile::ImgeItem_*,_std::vector<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>_>
                     ::operator++(&local_98,0);
    }
    if (((it._M_current._3_1_ & 1) == 0) || (item.size < (uint)(imge_item.gap_bits << 5))) {
      return false;
    }
    i = 0;
    data_bits = imge_item.track_byte;
    for (gap_bits = 0; uVar10 = block._4_4_, gap_bits < (uint)imge_item.gap_bits;
        gap_bits = gap_bits + 1) {
      data_bytes = ExtractInt(item.buffer + block._4_4_);
      gap_bytes = ExtractInt(item.buffer + (block._4_4_ + 4));
      gap_offset = 0;
      cell_type = 0;
      encoder_type = 0;
      if (this->encoder_type_ == 1) {
        gap_offset = ExtractInt(item.buffer + (block._4_4_ + 8));
        cell_type = ExtractInt(item.buffer + (block._4_4_ + 0xc));
      }
      else {
        encoder_type = ExtractInt(item.buffer + (block._4_4_ + 8));
        ExtractInt(item.buffer + (block._4_4_ + 0xc));
      }
      block._4_4_ = block._4_4_ + 0x10;
      ExtractInt(item.buffer + block._4_4_);
      uVar3 = ExtractInt(item.buffer + (uVar10 + 0x14));
      uVar4 = ExtractInt(item.buffer + (uVar10 + 0x18));
      uVar5 = ExtractInt(item.buffer + (uVar10 + 0x1c));
      block._4_4_ = uVar10 + 0x20;
      uVar9 = (ulong)(uint)encoder_type;
      pbVar8 = item.buffer + (int)uVar5;
      encoder_type = 0;
      memset(&forward_stream,0,8);
      memset(&stack0xffffffffffffff00,0,8);
      size_width._3_1_ = 0;
      size_width._2_1_ = 0;
      if ((uVar3 & 1) == 1) {
        iVar6 = (*this->_vptr_CAPSFile[8])
                          (this,&stack0xffffffffffffff00,item.buffer + uVar9,&encoder_type,
                           (ulong)item.size);
        size_width._3_1_ = (byte)iVar6 & 1;
      }
      if ((uVar3 & 2) == 2) {
        iVar6 = (*this->_vptr_CAPSFile[8])
                          (this,&forward_stream,item.buffer + uVar9,&encoder_type,(ulong)item.size);
        size_width._2_1_ = (byte)iVar6 & 1;
      }
      size_width._1_1_ = *pbVar8;
      current_block_gap._4_4_ = 1;
      while (size_width._1_1_ != 0) {
        bVar2 = size_width._1_1_ & 0x1f;
        c = 0;
        for (iStack_11c = 0; iStack_11c < (int)(uint)size_width._1_1_ >> 5;
            iStack_11c = iStack_11c + 1) {
          c = ((uint)pbVar8[current_block_gap._4_4_] <<
              (((char)((int)(uint)size_width._1_1_ >> 5) - ((char)iStack_11c + '\x01')) * '\b' &
              0x1fU)) + c;
          current_block_gap._4_4_ = current_block_gap._4_4_ + 1;
        }
        if ((uVar3 & 4) == 4) {
          while (c != 0) {
            if (bVar2 == 5) {
              for (maxbits = 0; maxbits < c; maxbits = maxbits + 1) {
                uVar10 = data_bits + 1;
                disk->side_[(int)imge_item.header.crc].tracks[(int)imge_item.header.length].bitfield
                [(uint)data_bits] = '\x04';
                data_bits = uVar10;
                if (disk->side_[(int)imge_item.header.crc].tracks[(int)imge_item.header.length].size
                    <= uVar10) {
                  data_bits = 0;
                }
              }
              c = 0;
            }
            else {
              iVar6 = current_block_gap._4_4_ + 1;
              byte_00 = pbVar8[current_block_gap._4_4_];
              current_block_gap._4_4_ = iVar6;
              if (bVar2 == 1) {
                if (c < 9) {
                  val_1 = 8;
                  for (iStack_138 = 0; iStack_138 < c; iStack_138 = iStack_138 + 1) {
                    val_1 = val_1 + -1;
                    uVar10 = data_bits + 1;
                    disk->side_[(int)imge_item.header.crc].tracks[(int)imge_item.header.length].
                    bitfield[(uint)data_bits] =
                         (byte)((int)(uint)byte_00 >> ((byte)val_1 & 0x1f)) & 1;
                    data_bits = uVar10;
                    if (disk->side_[(int)imge_item.header.crc].tracks[(int)imge_item.header.length].
                        size <= uVar10) {
                      data_bits = 0;
                    }
                  }
                  c = 0;
                }
                else {
                  val = 8;
                  for (maxbits_1 = 0; maxbits_1 < 8; maxbits_1 = maxbits_1 + 1) {
                    val = val + -1;
                    uVar10 = data_bits + 1;
                    disk->side_[(int)imge_item.header.crc].tracks[(int)imge_item.header.length].
                    bitfield[(uint)data_bits] = (byte)((int)(uint)byte_00 >> ((byte)val & 0x1f)) & 1
                    ;
                    data_bits = uVar10;
                    if (disk->side_[(int)imge_item.header.crc].tracks[(int)imge_item.header.length].
                        size <= uVar10) {
                      data_bits = 0;
                    }
                  }
                  c = c + -8;
                }
              }
              else if (c < 8) {
                data_bits = IDisk::AddByteToSpecificTrack
                                      (disk,imge_item.header.crc,imge_item.header.length,data_bits,
                                       byte_00,c << 1);
                c = 0;
              }
              else {
                data_bits = IDisk::AddByteToSpecificTrack
                                      (disk,imge_item.header.crc,imge_item.header.length,data_bits,
                                       byte_00,0x10);
                c = c + -8;
              }
            }
          }
        }
        else if (bVar2 == 5) {
          for (iStack_144 = 0; iStack_144 < c * 0x10; iStack_144 = iStack_144 + 1) {
            if ((iStack_144 < 0x1001) && (c == 0x200)) {
              data_bits = IDisk::AddByteToSpecificTrack
                                    (disk,imge_item.header.crc,imge_item.header.length,data_bits,
                                     0xe5,0x10);
              iStack_144 = iStack_144 + 0xf;
            }
            else {
              uVar10 = data_bits + 1;
              disk->side_[(int)imge_item.header.crc].tracks[(int)imge_item.header.length].bitfield
              [(uint)data_bits] = '\x04';
              data_bits = uVar10;
              if (disk->side_[(int)imge_item.header.crc].tracks[(int)imge_item.header.length].size
                  <= uVar10) {
                data_bits = 0;
              }
            }
          }
        }
        else {
          for (dbg = 0; dbg < c; dbg = dbg + 1) {
            if (bVar2 == 1) {
              data_bits = IDisk::AddMFMByteToAllTrack
                                    (disk,imge_item.header.crc,imge_item.header.length,data_bits,
                                     pbVar8[current_block_gap._4_4_],8);
            }
            else {
              data_bits = IDisk::AddByteToSpecificTrack
                                    (disk,imge_item.header.crc,imge_item.header.length,data_bits,
                                     pbVar8[current_block_gap._4_4_],0x10);
            }
            current_block_gap._4_4_ = current_block_gap._4_4_ + 1;
          }
        }
        size_width._1_1_ = pbVar8[current_block_gap._4_4_];
        current_block_gap._4_4_ = current_block_gap._4_4_ + 1;
      }
      i = data_bytes + i;
      byte_01 = (uchar)uVar4;
      if (this->encoder_type_ == 1) {
        for (nb_bytes = 0; (uint)nb_bytes < (uint)gap_bytes; nb_bytes = nb_bytes + 0x10) {
          if ((uint)(gap_bytes - nb_bytes) < 0x10) {
            data_bits = IDisk::AddByteToSpecificTrack
                                  (disk,imge_item.header.crc,imge_item.header.length,data_bits,
                                   byte_01,gap_bytes - nb_bytes);
            nb_bytes = gap_bytes;
          }
          else {
            data_bits = IDisk::AddByteToSpecificTrack
                                  (disk,imge_item.header.crc,imge_item.header.length,data_bits,
                                   byte_01,0x10);
          }
        }
      }
      else {
        if ((uint)gap_bytes < uStack_100 * 2 + forward_stream.size * 2) {
          uStack_100 = gap_bytes + forward_stream.size * -2 >> 1;
        }
        else if (uStack_100 * 2 + forward_stream.size * 2 < (uint)gap_bytes) {
          if ((size_width._3_1_ == 0) || (uStack_100 != 0)) {
            if ((size_width._2_1_ != 0) && (forward_stream.size == 0)) {
              forward_stream.size = gap_bytes + uStack_100 * -2 >> 1;
            }
          }
          else if ((size_width._2_1_ == 0) || (forward_stream.size != 0)) {
            uStack_100 = gap_bytes + forward_stream.size * -2 >> 1;
          }
          else {
            uStack_100 = (uint)gap_bytes >> 2;
            forward_stream.size = gap_bytes + uStack_100 * -2 >> 1;
          }
        }
        if (size_width._3_1_ != 0) {
          if (uStack_100 == 0) {
            if (forward_stream.size == 0) {
              uStack_100 = (uint)gap_bytes >> 2;
              forward_stream.size = uStack_100;
              forward_stream.sample = byte_01;
            }
            else {
              uStack_100 = ((uint)gap_bytes >> 1) - forward_stream.size;
            }
          }
          for (gp = 0; (uint)gp < uStack_100 << 1; gp = gp + 0x10) {
            if (uStack_100 * 2 - gp < 0x10) {
              data_bits = IDisk::AddByteToSpecificTrack
                                    (disk,imge_item.header.crc,imge_item.header.length,data_bits,
                                     total_gap._1_1_,uStack_100 * 2 - gp);
              gp = uStack_100 << 1;
            }
            else if ((char)total_gap == '\b') {
              data_bits = IDisk::AddByteToSpecificTrack
                                    (disk,imge_item.header.crc,imge_item.header.length,data_bits,
                                     total_gap._1_1_,0x10);
            }
          }
        }
        if (uStack_100 * 2 + forward_stream.size * 2 < (uint)gap_bytes) {
          iVar6 = gap_bytes - (uStack_100 * 2 + forward_stream.size * 2);
          for (local_160 = 0; local_160 < iVar6; local_160 = local_160 + 0x10) {
            if (iVar6 < local_160 + 0x10) {
              data_bits = IDisk::AddByteToSpecificTrack
                                    (disk,imge_item.header.crc,imge_item.header.length,data_bits,'N'
                                     ,iVar6 - local_160);
            }
            else {
              data_bits = IDisk::AddByteToSpecificTrack
                                    (disk,imge_item.header.crc,imge_item.header.length,data_bits,'N'
                                     ,0x10);
            }
          }
        }
        if (size_width._2_1_ != 0) {
          local_164 = 0;
          if ((forward_stream.size & 7) != 0) {
            local_164 = forward_stream.size & 7;
            data_bits = IDisk::AddByteToSpecificTrack
                                  (disk,imge_item.header.crc,imge_item.header.length,data_bits,
                                   forward_stream.sample,local_164);
          }
          for (; local_164 < forward_stream.size << 1; local_164 = local_164 + 0x10) {
            if (forward_stream.size * 2 - local_164 < 0x10) {
              data_bits = IDisk::AddByteToSpecificTrack
                                    (disk,imge_item.header.crc,imge_item.header.length,data_bits,
                                     forward_stream.sample,forward_stream.size * 2 - local_164);
              local_164 = forward_stream.size << 1;
            }
            else if (forward_stream.sample_size == '\b') {
              data_bits = IDisk::AddByteToSpecificTrack
                                    (disk,imge_item.header.crc,imge_item.header.length,data_bits,
                                     forward_stream.sample,0x10);
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool CAPSFile::DecodeData(DataChunks item, IDisk* disk)
{
   unsigned int offset = 0;
   unsigned char* block = item.buffer;
   unsigned char* data_block = &block[offset];

   int total_total = 0;
   // Now, extra data blocks ?
   if (item.size != 0)
   {
      // Get block count from IMGE
      ImgeItem imge_item;
      bool found = false;
      for (std::vector<ImgeItem>::iterator it = list_imge_.begin(); it != list_imge_.end() && (!found); it++)
      {
         if (it->data_key == item.data_id)
         {
            // Found !
            imge_item = *it;
            found = true;
         }
      }
      if (!found || (imge_item.block_count * 32 > item.size))
      {
         // Error !
         return false;
         // TODO : Save this chunk for later use ?
         //break;
      }
      else
      {
         int total_data = 0;

         unsigned int index_track = imge_item.start_bit_pos;
         for (DWORD i = 0; i < imge_item.block_count; i++)
         {
            // Read descriptors
            int data_bits = ExtractInt(&block[offset]);
            offset += 4;
            unsigned int gap_bits = ExtractInt(&block[offset]);
            offset += 4;
            int data_bytes = 0;
            int gap_bytes = 0;
            unsigned int gap_offset = 0;
            int cell_type = 0;
            if (encoder_type_ == 1)
            {
               data_bytes = ExtractInt(&block[offset]);
               offset += 4;
               gap_bytes = ExtractInt(&block[offset]);
               offset += 4;
            }
            else
            {
               gap_offset = ExtractInt(&block[offset]);
               offset += 4;
               cell_type = ExtractInt(&block[offset]);
               offset += 4;
            }
            int encoder_type = ExtractInt(&block[offset]);
            offset += 4;
            int block_flags = ExtractInt(&block[offset]);
            offset += 4;
            int gap_default = ExtractInt(&block[offset]);
            offset += 4;
            int data_offset = ExtractInt(&block[offset]);
            offset += 4;

            // Now, remaining datas
            unsigned char* current_block_gap = &data_block[gap_offset];
            unsigned char* current_block_data = &data_block[data_offset];
            data_offset = 0;
            gap_offset = 0;
            // Do we have backward gap ?
            // Read Forward / Backward streams
            StreamItem backward_stream = {0};
            StreamItem forward_stream = {0};

            unsigned int total_gap = 0;
            bool forward_gap = false;
            bool backward_gap = false;
            if ((block_flags & 0x1) == 0x1)
            {
               // Ok, Forward stream
               forward_gap = GetStreamGapItem(&forward_stream, current_block_gap, gap_offset, item.size);
            }
            if ((block_flags & 0x2) == 0x2)
            {
               // Ok, backward stream
               backward_gap = GetStreamGapItem(&backward_stream, current_block_gap, gap_offset, item.size);
            }

            // data
            unsigned char b = current_block_data[data_offset++];
            unsigned int offset_before = index_track;
            while (b != 0)
            {
               int size_width = b >> 5;
               int data_type = b & 0x1F;
               int data_size = 0;
               for (int j = 0; j < size_width; j++)
               {
                  data_size += (current_block_data[data_offset++] << (8 * (size_width - (j + 1))));
               }
               if ((block_flags & 0x4) == 0x4)
               {
                  // in bits
                  while (data_size != 0)
                  {
                     if (data_type == 5)
                     {
                        for (int c = 0; c < data_size; c++)
                        {
                           disk->side_[imge_item.side].tracks[imge_item.track_number].bitfield[index_track++] =
                              BIT_WEAK;
                           if (index_track >= disk->side_[imge_item.side].tracks[imge_item.track_number].size)
                              index_track = 0;
                        }
                        data_size = 0;
                     }
                     else
                     {
                        unsigned char bitfield = current_block_data[data_offset++];
                        if (data_type == 1)
                        {
                           if (data_size > 8)
                           {
                              int maxbits = 8;
                              for (int d = 0; d < 8; d++)
                              {
                                 maxbits--;
                                 int val = (bitfield >> maxbits) & 0x1;
                                 disk->side_[imge_item.side].tracks[imge_item.track_number].bitfield[index_track++] =
                                    val;
                                 if (index_track >= disk->side_[imge_item.side].tracks[imge_item.track_number].size)
                                    index_track = 0;
                              }
                              data_size -= 8;
                           }
                           else
                           {
                              int maxbits = 8;
                              for (int d = 0; d < data_size; d++)
                              {
                                 maxbits--;
                                 int val = (bitfield >> maxbits) & 0x1;
                                 disk->side_[imge_item.side].tracks[imge_item.track_number].bitfield[index_track++] =
                                    val;
                                 if (index_track >= disk->side_[imge_item.side].tracks[imge_item.track_number].size)
                                    index_track = 0;
                              }
                              data_size = 0;
                           }
                        }
                           // in bytes
                        else
                        {
                           // Convert to MFM
                           if (data_size >= 8)
                           {
                              index_track = disk->AddByteToSpecificTrack(
                                 imge_item.side, imge_item.track_number, index_track, bitfield);
                              data_size -= 8;
                           }
                           else
                           {
                              // Convert to MFM
                              index_track = disk->AddByteToSpecificTrack(
                                 imge_item.side, imge_item.track_number, index_track, bitfield, data_size * 2);
                              data_size -= data_size;
                           }
                        }
                     }
                  }
               }
               else
               {
                  // in bytes
                  if (data_type == 5)
                  {
                     // weak bit ??
                     unsigned char byte = 0xE5;

                     for (int c = 0; c < data_size * 16; c++)
                     {
                        if (c > 256 * 16 || data_size != 512)
                        {
                           disk->side_[imge_item.side].tracks[imge_item.track_number].bitfield[index_track++] =
                              BIT_WEAK;
                           if (index_track >= disk->side_[imge_item.side].tracks[imge_item.track_number].size)
                              index_track = 0;
                        }
                        else
                        {
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, byte);
                           c += 15;
                        }
                     }
                     //dataoffset++;
                  }
                  else
                  {
                     if (data_type == 3)
                     {
                        //totalGap += dataSize*16;
                     }
                     for (int c = 0; c < data_size; c++)
                     {
                        unsigned char byte = 0;
                        {
                           byte = current_block_data[data_offset++];

                           if (data_type == 1)
                           {
                              index_track = disk->AddMFMByteToAllTrack(imge_item.side, imge_item.track_number,
                                                                       index_track, byte, 8);
                           }
                           else
                           {
                              index_track = disk->AddByteToSpecificTrack(
                                 imge_item.side, imge_item.track_number, index_track, byte);
                           }
                        }
                     }
                  }
               }
               b = current_block_data[data_offset++];
            }
            if (offset_before > index_track)
            {
               offset_before = offset_before - disk->side_[imge_item.side].tracks[imge_item.track_number].size;
            }
            total_total += data_bits; //indexTrack - offsetBefore;
            total_data += data_bits;
            if ((data_bits != index_track - offset_before)
               && ((index_track != offset_before)
                  || (data_bits != disk->side_[imge_item.side].tracks[imge_item.track_number].size)
               )
            )
            {
               //
               int dbg = 1;
            }


            if (encoder_type_ == 1)
            {
               // GAP via CAPS encoding
               for (unsigned int c = 0; c < gap_bits; c += 16)
               {
                  if (gap_bits - c < 16)
                  {
                     // Add what we need to
                     index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                gap_default, (gap_bits - c));

                     // then quit
                     total_gap += gap_bits - c;
                     c = gap_bits;
                  }
                  else
                  {
                     {
                        index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                   gap_default);

                        if (index_track > imge_item.start_bit_pos && index_track < imge_item.start_bit_pos + 16)
                        {

                        }

                        total_gap += 16;
                     }
                  }
               }
            }
            else
            {
               if (forward_stream.size * 2 + backward_stream.size * 2 > gap_bits)
               {
                  // Remove from forward
                  forward_stream.size = (gap_bits - backward_stream.size * 2) / 2;
               }
               else
               {
                  if (forward_stream.size * 2 + backward_stream.size * 2 < gap_bits)
                  {
                     // Adjust :
                     //
                     if (forward_gap && forward_stream.size == 0)
                     {
                        if (backward_gap && backward_stream.size == 0)
                        {
                           forward_stream.size = gap_bits / 4;
                           backward_stream.size = (gap_bits - forward_stream.size * 2) / 2;
                        }
                        else
                        {
                           forward_stream.size = (gap_bits - backward_stream.size * 2) / 2;
                        }
                     }
                     else
                     {
                        if (backward_gap && backward_stream.size == 0)
                        {
                           backward_stream.size = (gap_bits - forward_stream.size * 2) / 2;
                        }
                     }
                  }
               }
               if (forward_gap)
               {
                  if (forward_stream.size == 0)
                  {
                     if (backward_stream.size != 0)
                     {
                        forward_stream.size = gap_bits / 2 - backward_stream.size;
                     }
                     else
                     {
                        forward_stream.size = backward_stream.size = gap_bits / 4;
                        backward_stream.sample = gap_default;
                     }
                     //forwardStream.Sample = gapDefault;
                  }
                  for (unsigned int c = 0; c < forward_stream.size * 2; c += 16)
                  {
                     if (forward_stream.size * 2 - c < 16)
                     {
                        // Add what we need to
                        index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                   forward_stream.sample,
                                                                   (forward_stream.size * 2 - c));

                        // then quit
                        total_gap += forward_stream.size * 2 - c;
                        c = forward_stream.size * 2;
                     }
                     else
                     {
                        if (forward_stream.sample_size == 8)
                        {
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, forward_stream.sample);

                           if (index_track > imge_item.start_bit_pos && index_track < imge_item.start_bit_pos + 16)
                           {
                           }

                           total_gap += 16;
                        }
                        else
                        {
                        }
                     }
                  }
               }
               // Between these two :
               {
                  if (forward_stream.size * 2 + backward_stream.size * 2 < gap_bits)
                  {
                     int nb_bytes = (gap_bits - (forward_stream.size * 2 + backward_stream.size * 2));
                     for (int gp = 0; gp < nb_bytes; gp += 16)
                     {
                        if (gp + 16 > nb_bytes)
                        {
                           // Add what we need to
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, 0x4E, (nb_bytes - gp));

                           // then quit
                           total_gap += nb_bytes - gp;
                        }
                        else
                        {
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, 0x4E);
                           total_gap += 16;
                        }

                        if (index_track > imge_item.start_bit_pos && index_track < imge_item.start_bit_pos + 16)
                        {
                        }
                     }
                  }
               }

               // Backward stream ?
               if (backward_gap)
               {
                  // First byte (or any part of it)
                  unsigned int c = 0;
                  if (backward_stream.size % 8 != 0)
                  {
                     // TODO
                     c = backward_stream.size % 8;
                     index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                backward_stream.sample, c);
                  }
                  for (; c < backward_stream.size * 2; c += 16)
                  {
                     if (backward_stream.size * 2 - c < 16)
                     {
                        // Add what we need to
                        index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                   backward_stream.sample,
                                                                   (backward_stream.size * 2 - c));

                        // then quit
                        total_gap += backward_stream.size * 2 - c;
                        c = backward_stream.size * 2;
                     }
                     else
                     {
                        if (backward_stream.sample_size == 8)
                        {
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, backward_stream.sample);

                           if (index_track > imge_item.start_bit_pos && index_track < imge_item.start_bit_pos + 16)
                           {
                           }

                           total_gap += 16;
                        }
                        else
                        {
                        }
                     }
                  }
               }
            }
            if (total_gap != gap_bits)
            {
            }
            //else
            total_total += total_gap;
         }

         // Check index / size
         if (index_track != imge_item.start_bit_pos || total_total != disk->side_[imge_item.side].tracks[imge_item.
            track_number].size)
         {
         }
      }
   }

   return true;
}